

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O1

void __thiscall
DebugUtilsData::WrapCallbackData
          (DebugUtilsData *this,AugmentedCallbackData *aug_data,
          XrDebugUtilsMessengerCallbackDataEXT *callback_data)

{
  XrDebugUtilsObjectNameInfoEXT *pXVar1;
  pointer pXVar2;
  pointer pXVar3;
  byte bVar4;
  undefined4 uVar5;
  byte bVar6;
  XrSdkLogObjectInfo *pXVar7;
  pointer pXVar8;
  long lVar9;
  XrDebugUtilsMessengerCallbackDataEXT *pXVar10;
  XrDebugUtilsMessengerCallbackDataEXT *pXVar11;
  ulong uVar12;
  XrDebugUtilsObjectNameInfoEXT *obj;
  pointer info;
  byte bVar13;
  XrSdkLogObjectInfo local_60;
  
  bVar13 = 0;
  aug_data->exported_data = callback_data;
  if ((this->object_info_).object_info_.
      super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->object_info_).object_info_.
      super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  if (callback_data->objectCount == 0) {
    return;
  }
  if (callback_data->objectCount != 0) {
    lVar9 = 0x18;
    uVar12 = 0;
    bVar6 = 0;
    do {
      bVar4 = bVar6;
      pXVar1 = callback_data->objects;
      local_60.handle = *(uint64_t *)((long)&pXVar1->type + lVar9);
      local_60.type = *(XrObjectType *)((long)pXVar1 + lVar9 + -8);
      local_60.name._M_dataplus._M_p = (pointer)&local_60.name.field_2;
      local_60.name._M_string_length = 0;
      local_60.name.field_2._M_local_buf[0] = '\0';
      pXVar7 = ObjectInfoCollection::LookUpStoredObjectInfo(&this->object_info_,&local_60);
      if (*(int *)((long)pXVar1 + lVar9 + -8) == 2) {
        LookUpSessionLabels(this,*(XrSession *)((long)&pXVar1->type + lVar9),&aug_data->labels);
      }
      uVar12 = uVar12 + 1;
      lVar9 = lVar9 + 0x28;
      bVar6 = bVar4 | pXVar7 != (XrSdkLogObjectInfo *)0x0;
    } while (uVar12 < callback_data->objectCount);
    if ((bool)(bVar4 | pXVar7 != (XrSdkLogObjectInfo *)0x0)) goto LAB_0011d778;
  }
  if ((aug_data->labels).
      super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (aug_data->labels).
      super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
LAB_0011d778:
  pXVar10 = callback_data;
  pXVar11 = &aug_data->modified_data;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar5 = *(undefined4 *)&pXVar10->field_0x4;
    pXVar11->type = pXVar10->type;
    *(undefined4 *)&pXVar11->field_0x4 = uVar5;
    pXVar10 = (XrDebugUtilsMessengerCallbackDataEXT *)((long)pXVar10 + (ulong)bVar13 * -0x10 + 8);
    pXVar11 = (XrDebugUtilsMessengerCallbackDataEXT *)((long)pXVar11 + (ulong)bVar13 * -0x10 + 8);
  }
  std::vector<XrDebugUtilsObjectNameInfoEXT,std::allocator<XrDebugUtilsObjectNameInfoEXT>>::
  _M_assign_aux<XrDebugUtilsObjectNameInfoEXT*>
            ((vector<XrDebugUtilsObjectNameInfoEXT,std::allocator<XrDebugUtilsObjectNameInfoEXT>> *)
             &aug_data->new_objects,callback_data->objects,
             callback_data->objects + callback_data->objectCount);
  pXVar2 = (aug_data->new_objects).
           super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (info = (aug_data->new_objects).
              super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
              ._M_impl.super__Vector_impl_data._M_start; info != pXVar2; info = info + 1) {
    ObjectInfoCollection::LookUpObjectName(&this->object_info_,info);
  }
  (aug_data->modified_data).objects =
       (aug_data->new_objects).
       super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pXVar3 = (aug_data->labels).
           super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (long)(aug_data->labels).
                 super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pXVar3;
  pXVar8 = (pointer)0x0;
  if (uVar12 != 0) {
    pXVar8 = pXVar3;
  }
  (aug_data->modified_data).sessionLabelCount = (int)(uVar12 >> 3) * -0x55555555;
  (aug_data->modified_data).sessionLabels = pXVar8;
  aug_data->exported_data = &aug_data->modified_data;
  return;
}

Assistant:

void DebugUtilsData::WrapCallbackData(AugmentedCallbackData* aug_data,
                                      const XrDebugUtilsMessengerCallbackDataEXT* callback_data) const {
    // If there's nothing to add, just return the original data as the augmented copy
    aug_data->exported_data = callback_data;
    if (object_info_.Empty() || callback_data->objectCount == 0) {
        return;
    }

    // Inspect each of the callback objects
    bool name_found = false;
    for (uint32_t obj = 0; obj < callback_data->objectCount; ++obj) {
        auto& current_obj = callback_data->objects[obj];
        name_found |= (nullptr != object_info_.LookUpStoredObjectInfo(current_obj.objectHandle, current_obj.objectType));

        // If this is a session, record any labels associated with it
        if (XR_OBJECT_TYPE_SESSION == current_obj.objectType) {
            XrSession session = TreatIntegerAsHandle<XrSession>(current_obj.objectHandle);
            LookUpSessionLabels(session, aug_data->labels);
        }
    }

    // If we found nothing to add, return the original data
    if (!name_found && aug_data->labels.empty()) {
        return;
    }

    // Found additional data - modify an internal copy and return that as the exported data
    memcpy(&aug_data->modified_data, callback_data, sizeof(XrDebugUtilsMessengerCallbackDataEXT));
    aug_data->new_objects.assign(callback_data->objects, callback_data->objects + callback_data->objectCount);

    // Record (overwrite) the names of all incoming objects provided in our internal list
    for (auto& obj : aug_data->new_objects) {
        object_info_.LookUpObjectName(obj);
    }

    // Update local copy & point export to it
    aug_data->modified_data.objects = aug_data->new_objects.data();
    aug_data->modified_data.sessionLabelCount = static_cast<uint32_t>(aug_data->labels.size());
    aug_data->modified_data.sessionLabels = aug_data->labels.empty() ? nullptr : aug_data->labels.data();
    aug_data->exported_data = &aug_data->modified_data;
    return;
}